

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int balance(BtCursor *pCur)

{
  ushort uVar1;
  MemPage *pPage_00;
  MemPage *pParent_00;
  int iVar2;
  u8 *aOvflSpace;
  u8 *pSpace;
  int iIdx;
  MemPage *pParent;
  MemPage *pPage;
  u8 *puStack_30;
  int iPage;
  u8 *pFree;
  u8 aBalanceQuickSpace [13];
  int nMin;
  int rc;
  BtCursor *pCur_local;
  
  aBalanceQuickSpace[9] = '\0';
  aBalanceQuickSpace[10] = '\0';
  aBalanceQuickSpace[0xb] = '\0';
  aBalanceQuickSpace[0xc] = '\0';
  aBalanceQuickSpace._5_4_ = (pCur->pBt->usableSize << 1) / 3;
  puStack_30 = (u8 *)0x0;
  do {
    iVar2 = (int)pCur->iPage;
    pPage_00 = pCur->pPage;
    if (iVar2 == 0) {
      if (pPage_00->nOverflow == '\0') break;
      aBalanceQuickSpace._9_4_ = balance_deeper(pPage_00,pCur->apPage + 1);
      if (aBalanceQuickSpace._9_4_ == 0) {
        pCur->iPage = '\x01';
        pCur->ix = 0;
        pCur->aiIdx[0] = 0;
        pCur->apPage[0] = pPage_00;
        pCur->pPage = pCur->apPage[1];
      }
    }
    else {
      if ((pPage_00->nOverflow == '\0') &&
         ((int)(uint)pPage_00->nFree <= (int)aBalanceQuickSpace._5_4_)) break;
      pParent_00 = pCur->apPage[iVar2 + -1];
      uVar1 = pCur->aiIdx[iVar2 + -1];
      aBalanceQuickSpace._9_4_ = sqlite3PagerWrite(pParent_00->pDbPage);
      aOvflSpace = puStack_30;
      if (aBalanceQuickSpace._9_4_ == 0) {
        if ((((pPage_00->intKeyLeaf == '\0') || (pPage_00->nOverflow != '\x01')) ||
            (pPage_00->aiOvfl[0] != pPage_00->nCell)) ||
           ((pParent_00->pgno == 1 || ((uint)pParent_00->nCell != (uint)uVar1)))) {
          aOvflSpace = (u8 *)sqlite3PageMalloc(pCur->pBt->pageSize);
          aBalanceQuickSpace._9_4_ =
               balance_nonroot(pParent_00,(uint)uVar1,aOvflSpace,(uint)(iVar2 == 1),pCur->hints & 1)
          ;
          if (puStack_30 != (u8 *)0x0) {
            sqlite3PageFree(puStack_30);
          }
        }
        else {
          aBalanceQuickSpace._9_4_ = balance_quick(pParent_00,pPage_00,(u8 *)((long)&pFree + 3));
        }
      }
      puStack_30 = aOvflSpace;
      pPage_00->nOverflow = '\0';
      releasePage(pPage_00);
      pCur->iPage = pCur->iPage + -1;
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  } while (aBalanceQuickSpace._9_4_ == 0);
  if (puStack_30 != (u8 *)0x0) {
    sqlite3PageFree(puStack_30);
  }
  iVar2._0_1_ = aBalanceQuickSpace[9];
  iVar2._1_1_ = aBalanceQuickSpace[10];
  iVar2._2_1_ = aBalanceQuickSpace[0xb];
  iVar2._3_1_ = aBalanceQuickSpace[0xc];
  return iVar2;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}